

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseVariants(AsciiParser *this,VariantSelectionMap *out_map)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *this_00;
  string local_200;
  ostringstream local_1e0 [8];
  ostringstream ss_e;
  undefined1 local_68 [8];
  string var;
  string key;
  char c;
  VariantSelectionMap *out_map_local;
  AsciiParser *this_local;
  
  bVar1 = Expect(this,'{');
  if (bVar1) {
    bVar1 = SkipWhitespaceAndNewline(this,true);
    if (bVar1) {
      do {
        bVar1 = Eof(this);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0061020b:
          bVar1 = SkipWhitespaceAndNewline(this,true);
          if (bVar1) {
            this_local._7_1_ = 1;
          }
          else {
            this_local._7_1_ = 0;
          }
          break;
        }
        bVar1 = Char1(this,key.field_2._M_local_buf + 0xf);
        if (!bVar1) {
          this_local._7_1_ = 0;
          break;
        }
        if (key.field_2._M_local_buf[0xf] == '}') goto LAB_0061020b;
        bVar1 = Rewind(this,1);
        if (!bVar1) {
          this_local._7_1_ = 0;
          break;
        }
        ::std::__cxx11::string::string((string *)(var.field_2._M_local_buf + 8));
        ::std::__cxx11::string::string((string *)local_68);
        bVar1 = ParseVariantsElement(this,(string *)((long)&var.field_2 + 8),(string *)local_68);
        if (bVar1) {
          bVar1 = SkipWhitespaceAndNewline(this,true);
          if (bVar1) {
            this_00 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](out_map,(key_type *)((long)&var.field_2 + 8));
            ::std::__cxx11::string::operator=((string *)this_00,(string *)local_68);
            bVar1 = false;
          }
          else {
            this_local._7_1_ = 0;
            bVar1 = true;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1e0);
          poVar2 = ::std::operator<<((ostream *)local_1e0,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ParseVariants");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x42b);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_1e0,
                                     "Failed to parse an element of `variants`.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_200);
          ::std::__cxx11::string::~string((string *)&local_200);
          this_local._7_1_ = 0;
          bVar1 = true;
          ::std::__cxx11::ostringstream::~ostringstream(local_1e0);
        }
        ::std::__cxx11::string::~string((string *)local_68);
        ::std::__cxx11::string::~string((string *)(var.field_2._M_local_buf + 8));
      } while (!bVar1);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseVariants(VariantSelectionMap *out_map) {
  // '{' (string name '=' value)+ '}'
  if (!Expect('{')) {
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      std::string key;
      std::string var;
      if (!ParseVariantsElement(&key, &var)) {
        PUSH_ERROR_AND_RETURN("Failed to parse an element of `variants`.");
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }

      DCOUT("Add to variants: " << key);
      (*out_map)[key] = var;
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  return true;
}